

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_lnspec.cpp
# Opt level: O2

int LS_Sector_ChangeFlags
              (line_t *ln,AActor *it,bool backSide,int arg0,int arg1,int arg2,int arg3,int arg4)

{
  uint uVar1;
  int iVar2;
  FSectorTagIterator itr;
  
  if (arg0 == 0) {
    iVar2 = 0;
  }
  else {
    itr.start = tagManager.TagHashFirst[(ulong)(uint)arg0 & 0xff];
    itr.searchtag = arg0;
    iVar2 = 0;
    while( true ) {
      uVar1 = FSectorTagIterator::Next(&itr);
      if ((int)uVar1 < 0) break;
      sectors[uVar1].Flags = (sectors[uVar1].Flags | arg1 & 0x3fffffffU) & (~arg2 | 0xc0000000U);
      iVar2 = 1;
    }
  }
  return iVar2;
}

Assistant:

FUNC(LS_Sector_ChangeFlags)
// Sector_ChangeFlags (tag, set, clear)
{
	int secNum;
	bool rtn;

	if (!arg0)
		return false;

	rtn = false;
	FSectorTagIterator itr(arg0);
	// exclude protected flags
	arg1 &= ~SECF_NOMODIFY;
	arg2 &= ~SECF_NOMODIFY;
	while ((secNum = itr.Next()) >= 0)
	{
		sectors[secNum].Flags = (sectors[secNum].Flags | arg1) & ~arg2;
		rtn = true;
	}
	return rtn;
}